

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMan.c
# Opt level: O2

Amap_Man_t * Amap_ManStart(int nNodes)

{
  Amap_Man_t *pAVar1;
  Vec_Ptr_t *pVVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  Aig_MmFixed_t *pAVar5;
  Aig_MmFlex_t *pAVar6;
  int iVar7;
  
  iVar7 = 1;
  pAVar1 = (Amap_Man_t *)calloc(1,0xd8);
  pAVar1->fEpsilonInternal = 0.01;
  pVVar2 = Vec_PtrAlloc(iVar7);
  pAVar1->vPis = pVVar2;
  pVVar2 = Vec_PtrAlloc(iVar7);
  pAVar1->vPos = pVVar2;
  pVVar2 = Vec_PtrAlloc(iVar7);
  pAVar1->vObjs = pVVar2;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nCap = 100;
  pVVar3->nSize = 0;
  iVar7 = 400;
  piVar4 = (int *)malloc(400);
  pVVar3->pArray = piVar4;
  pAVar1->vTemp = pVVar3;
  pVVar2 = Vec_PtrAlloc(iVar7);
  pAVar1->vCuts0 = pVVar2;
  pVVar2 = Vec_PtrAlloc(iVar7);
  pAVar1->vCuts1 = pVVar2;
  pVVar2 = Vec_PtrAlloc(iVar7);
  pAVar1->vCuts2 = pVVar2;
  pVVar2 = Vec_PtrAlloc(iVar7);
  pAVar1->vTempP = pVVar2;
  pAVar5 = Aig_MmFixedStart(0x60,nNodes);
  pAVar1->pMemObj = pAVar5;
  pAVar6 = Aig_MmFlexStart();
  pAVar1->pMemCuts = pAVar6;
  pAVar6 = Aig_MmFlexStart();
  pAVar1->pMemCutBest = pAVar6;
  pAVar6 = Aig_MmFlexStart();
  pAVar1->pMemTemp = pAVar6;
  return pAVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts the AIG manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Amap_Man_t * Amap_ManStart( int nNodes )
{
    Amap_Man_t * p;
    // start the manager
    p = ABC_ALLOC( Amap_Man_t, 1 );
    memset( p, 0, sizeof(Amap_Man_t) );
    p->fEpsilonInternal = (float)0.01;
    // allocate arrays for nodes
    p->vPis    = Vec_PtrAlloc( 100 );
    p->vPos    = Vec_PtrAlloc( 100 );
    p->vObjs   = Vec_PtrAlloc( 100 );
    p->vTemp   = Vec_IntAlloc( 100 );
    p->vCuts0  = Vec_PtrAlloc( 100 );
    p->vCuts1  = Vec_PtrAlloc( 100 );
    p->vCuts2  = Vec_PtrAlloc( 100 );
    p->vTempP  = Vec_PtrAlloc( 100 );
    // prepare the memory manager
    p->pMemObj = Aig_MmFixedStart( sizeof(Amap_Obj_t), nNodes );
    p->pMemCuts = Aig_MmFlexStart();
    p->pMemCutBest = Aig_MmFlexStart();
    p->pMemTemp = Aig_MmFlexStart();
    return p;
}